

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::Reflection::MutableUnknownFields(Reflection *this,Message *message)

{
  Descriptor *expected;
  Reflection *pRVar1;
  Descriptor *actual;
  InternalMetadata *this_00;
  UnknownFieldSet *pUVar2;
  Message *message_local;
  Reflection *this_local;
  
  pRVar1 = Message::GetReflection(message);
  if (this != pRVar1) {
    expected = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,actual,(FieldDescriptor *)0x0,"MutableUnknownFields");
  }
  this_00 = MutableInternalMetadata(this,message);
  pUVar2 = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                     (this_00);
  return pUVar2;
}

Assistant:

UnknownFieldSet* Reflection::MutableUnknownFields(Message* message) const {
  STATIC_USAGE_CHECK_MESSAGE(MutableUnknownFields, message);
  return MutableInternalMetadata(message)
      ->mutable_unknown_fields<UnknownFieldSet>();
}